

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector2.cc
# Opt level: O0

ostream * RVO::operator<<(ostream *stream,Vector2 *vector)

{
  ostream *poVar1;
  Vector2 *in_RSI;
  ostream *in_RDI;
  float fVar2;
  
  poVar1 = std::operator<<(in_RDI,"(");
  fVar2 = Vector2::x(in_RSI);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,fVar2);
  poVar1 = std::operator<<(poVar1,",");
  fVar2 = Vector2::y(in_RSI);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,fVar2);
  std::operator<<(poVar1,")");
  return in_RDI;
}

Assistant:

std::ostream &operator<<(std::ostream &stream, const Vector2 &vector) {
  stream << "(" << vector.x() << "," << vector.y() << ")";

  return stream;
}